

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_go_generator.cc
# Opt level: O0

void __thiscall
t_go_generator::generate_countsetfields_helper
          (t_go_generator *this,ostream *out,t_struct *tstruct,string *tstruct_name,bool is_result)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  e_req eVar4;
  members_type *this_00;
  undefined4 extraout_var;
  ostream *poVar5;
  reference pptVar6;
  t_type *this_01;
  string *psVar7;
  string local_1a8;
  string local_188;
  string local_168;
  string local_148;
  string local_128;
  string local_108;
  undefined1 local_e8 [8];
  string field_name;
  t_type *type;
  t_field **local_b8;
  string local_b0;
  string local_80;
  string local_60 [8];
  string escaped_tstruct_name;
  const_iterator f_iter;
  vector<t_field_*,_std::allocator<t_field_*>_> *fields;
  bool is_result_local;
  string *tstruct_name_local;
  t_struct *tstruct_local;
  ostream *out_local;
  t_go_generator *this_local;
  
  this_00 = t_struct::get_members(tstruct);
  __gnu_cxx::
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
  __normal_iterator((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                     *)((long)&escaped_tstruct_name.field_2 + 8));
  iVar3 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])();
  (*(this->super_t_generator)._vptr_t_generator[3])(local_60,this,CONCAT44(extraout_var,iVar3));
  t_generator::indent_abi_cxx11_(&local_80,&this->super_t_generator);
  poVar5 = std::operator<<(out,(string *)&local_80);
  poVar5 = std::operator<<(poVar5,"func (p *");
  poVar5 = std::operator<<(poVar5,(string *)tstruct_name);
  poVar5 = std::operator<<(poVar5,") CountSetFields");
  poVar5 = std::operator<<(poVar5,(string *)tstruct_name);
  poVar5 = std::operator<<(poVar5,"() int {");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_80);
  t_generator::indent_up(&this->super_t_generator);
  t_generator::indent_abi_cxx11_(&local_b0,&this->super_t_generator);
  poVar5 = std::operator<<(out,(string *)&local_b0);
  poVar5 = std::operator<<(poVar5,"count := 0");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_b0);
  local_b8 = (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(this_00);
  escaped_tstruct_name.field_2._8_8_ = local_b8;
  while( true ) {
    type = (t_type *)std::vector<t_field_*,_std::allocator<t_field_*>_>::end(this_00);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                        *)((long)&escaped_tstruct_name.field_2 + 8),
                       (__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                        *)&type);
    if (!bVar1) break;
    pptVar6 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                           *)((long)&escaped_tstruct_name.field_2 + 8));
    eVar4 = t_field::get_req(*pptVar6);
    if (eVar4 != T_REQUIRED) {
      pptVar6 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator*((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                             *)((long)&escaped_tstruct_name.field_2 + 8));
      this_01 = t_field::get_type(*pptVar6);
      field_name.field_2._8_8_ = t_type::get_true_type(this_01);
      pptVar6 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator*((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                             *)((long)&escaped_tstruct_name.field_2 + 8));
      bVar1 = is_pointer_field(*pptVar6,false);
      if ((((bVar1) ||
           (bVar2 = (**(code **)(*(long *)field_name.field_2._8_8_ + 0x80))(), (bVar2 & 1) != 0)) ||
          (bVar2 = (**(code **)(*(long *)field_name.field_2._8_8_ + 0x78))(), (bVar2 & 1) != 0)) ||
         ((bVar2 = (**(code **)(*(long *)field_name.field_2._8_8_ + 0x70))(), (bVar2 & 1) != 0 ||
          (bVar2 = (**(code **)(*(long *)field_name.field_2._8_8_ + 0x38))(), (bVar2 & 1) != 0)))) {
        pptVar6 = __gnu_cxx::
                  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                  ::operator*((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                               *)((long)&escaped_tstruct_name.field_2 + 8));
        psVar7 = t_field::get_name_abi_cxx11_(*pptVar6);
        (*(this->super_t_generator)._vptr_t_generator[3])(&local_108,this,psVar7);
        publicize((string *)local_e8,this,&local_108,false);
        std::__cxx11::string::~string((string *)&local_108);
        t_generator::indent_abi_cxx11_(&local_128,&this->super_t_generator);
        poVar5 = std::operator<<(out,(string *)&local_128);
        poVar5 = std::operator<<(poVar5,"if (p.IsSet");
        poVar5 = std::operator<<(poVar5,(string *)local_e8);
        poVar5 = std::operator<<(poVar5,"()) {");
        std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_128);
        t_generator::indent_up(&this->super_t_generator);
        t_generator::indent_abi_cxx11_(&local_148,&this->super_t_generator);
        poVar5 = std::operator<<(out,(string *)&local_148);
        poVar5 = std::operator<<(poVar5,"count++");
        std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_148);
        t_generator::indent_down(&this->super_t_generator);
        t_generator::indent_abi_cxx11_(&local_168,&this->super_t_generator);
        poVar5 = std::operator<<(out,(string *)&local_168);
        poVar5 = std::operator<<(poVar5,"}");
        std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_168);
        std::__cxx11::string::~string((string *)local_e8);
      }
    }
    __gnu_cxx::
    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
    operator++((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                *)((long)&escaped_tstruct_name.field_2 + 8));
  }
  t_generator::indent_abi_cxx11_(&local_188,&this->super_t_generator);
  poVar5 = std::operator<<(out,(string *)&local_188);
  poVar5 = std::operator<<(poVar5,"return count");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_188);
  t_generator::indent_down(&this->super_t_generator);
  t_generator::indent_abi_cxx11_(&local_1a8,&this->super_t_generator);
  poVar5 = std::operator<<(out,(string *)&local_1a8);
  poVar5 = std::operator<<(poVar5,"}");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::__cxx11::string::~string(local_60);
  return;
}

Assistant:

void t_go_generator::generate_countsetfields_helper(ostream& out,
                                                    t_struct* tstruct,
                                                    const string& tstruct_name,
                                                    bool is_result) {
  (void)is_result;
  const vector<t_field*>& fields = tstruct->get_members();
  vector<t_field*>::const_iterator f_iter;
  const string escaped_tstruct_name(escape_string(tstruct->get_name()));

  out << indent() << "func (p *" << tstruct_name << ") CountSetFields" << tstruct_name << "() int {"
      << endl;
  indent_up();
  out << indent() << "count := 0" << endl;
  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    if ((*f_iter)->get_req() == t_field::T_REQUIRED)
      continue;

    t_type* type = (*f_iter)->get_type()->get_true_type();

    if (!(is_pointer_field(*f_iter) || type->is_map() || type->is_set() || type->is_list() || type->is_binary()))
      continue;

    const string field_name(publicize(escape_string((*f_iter)->get_name())));

    out << indent() << "if (p.IsSet" << field_name << "()) {" << endl;
    indent_up();
    out << indent() << "count++" << endl;
    indent_down();
    out << indent() << "}" << endl;
  }

  out << indent() << "return count" << endl << endl;
  indent_down();
  out << indent() << "}" << endl << endl;
}